

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LeopardFF16.cpp
# Opt level: O0

void leopard::ff16::InitializeMultiplyTables(void)

{
  ffe_t fVar1;
  void *pvVar2;
  __m128i value_hi;
  __m128i value_lo;
  ffe_t prod_1;
  ffe_t x;
  uint8_t prod_hi [16];
  uint8_t prod_lo [16];
  uint shift_1;
  uint i;
  int log_m_1;
  ffe_t prod;
  uint x_nibble;
  ffe_t *nibble_lut;
  uint shift;
  uint nibble;
  Product16Table *lut;
  int log_m;
  uint offset_1;
  uint8_t *data_1;
  uint offset;
  uint8_t *data;
  ushort local_1c2;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  int local_194;
  uint local_190;
  int local_18c;
  ffe_t local_186;
  uint local_184;
  void *local_180;
  int local_178;
  uint local_174;
  void *local_170;
  int local_164;
  undefined8 *local_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 *local_e8;
  undefined8 *local_e0;
  undefined8 *local_d8;
  undefined8 *local_b8;
  undefined8 *local_98;
  uint local_8c;
  long local_88;
  undefined8 local_80;
  long local_78;
  uint local_6c;
  long local_68;
  undefined8 local_60;
  long local_58;
  undefined8 uStack_30;
  undefined8 uStack_28;
  
  if ((CpuHasSSSE3 & 1) == 0) {
    Multiply16LUT = operator_new__(0x800000);
    for (local_164 = 0; local_164 < 0x10000; local_164 = local_164 + 1) {
      local_170 = (void *)((long)Multiply16LUT + (long)local_164 * 0x80);
      local_178 = 0;
      for (local_174 = 0; local_174 < 4; local_174 = local_174 + 1) {
        local_180 = (void *)((long)local_170 + (ulong)(local_174 << 4) * 2);
        for (local_184 = 0; local_184 < 0x10; local_184 = local_184 + 1) {
          local_186 = MultiplyLog(0,0x10);
          *(ffe_t *)((long)local_180 + (ulong)local_184 * 2) = local_186;
        }
        local_178 = local_178 + 4;
      }
    }
  }
  else {
    if ((CpuHasAVX2 & 1) == 0) {
      local_80 = 0x800000;
      pvVar2 = calloc(1,0x800020);
      if (pvVar2 == (void *)0x0) {
        local_78 = 0;
      }
      else {
        local_8c = (uint)pvVar2 & 0x1f;
        local_78 = (long)pvVar2 + (ulong)(0x20 - local_8c);
        *(char *)(local_78 + -1) = (char)local_8c;
      }
      Multiply128LUT = local_78;
      local_88 = local_78;
    }
    else {
      local_60 = 0x1000000;
      pvVar2 = calloc(1,0x1000020);
      if (pvVar2 == (void *)0x0) {
        local_58 = 0;
      }
      else {
        local_6c = (uint)pvVar2 & 0x1f;
        local_58 = (long)pvVar2 + (ulong)(0x20 - local_6c);
        *(char *)(local_58 + -1) = (char)local_6c;
      }
      Multiply256LUT = local_58;
      local_68 = local_58;
    }
    for (local_18c = 0; local_18c < 0x10000; local_18c = local_18c + 1) {
      local_194 = 0;
      for (local_190 = 0; local_190 < 4; local_190 = local_190 + 1) {
        for (local_1c2 = 0; local_1c2 < 0x10; local_1c2 = local_1c2 + 1) {
          fVar1 = MultiplyLog(0,0x10);
          *(char *)((long)&local_1b0 + (ulong)local_1c2) = (char)fVar1;
          *(char *)((long)&local_1c0 + (ulong)local_1c2) = (char)(fVar1 >> 8);
        }
        local_d8 = &local_1b0;
        local_e0 = &local_1c0;
        if ((CpuHasAVX2 & 1) == 0) {
          local_98 = (undefined8 *)
                     (Multiply128LUT + (long)local_18c * 0x80 + (ulong)local_190 * 0x10);
          *local_98 = local_1b0;
          local_98[1] = uStack_1a8;
          local_b8 = (undefined8 *)
                     (Multiply128LUT + (long)local_18c * 0x80 + 0x40 + (ulong)local_190 * 0x10);
          *local_b8 = local_1c0;
          local_b8[1] = uStack_1b8;
        }
        if ((CpuHasAVX2 & 1) != 0) {
          local_e8 = (undefined8 *)
                     (Multiply256LUT + (long)local_18c * 0x100 + (ulong)local_190 * 0x20);
          local_120 = uStack_30;
          uStack_118 = uStack_28;
          uStack_110 = uStack_30;
          uStack_108 = uStack_28;
          *local_e8 = uStack_30;
          local_e8[1] = uStack_28;
          local_e8[2] = uStack_30;
          local_e8[3] = uStack_28;
          local_128 = (undefined8 *)
                      ((ulong)local_190 * 0x20 + 0x80 + Multiply256LUT + (long)local_18c * 0x100);
          *local_128 = local_1b0;
          local_128[1] = uStack_1a8;
          local_128[2] = local_1b0;
          local_128[3] = uStack_1a8;
        }
        local_194 = local_194 + 4;
      }
    }
  }
  return;
}

Assistant:

static void InitializeMultiplyTables()
{
    // If we cannot use the PSHUFB instruction, generate Multiply8LUT:
    if (!CpuHasSSSE3)
    {
        Multiply16LUT = new Product16Table[65536];

        // For each log_m multiplicand:
#pragma omp parallel for
        for (int log_m = 0; log_m < (int)kOrder; ++log_m)
        {
            const Product16Table& lut = Multiply16LUT[log_m];

            for (unsigned nibble = 0, shift = 0; nibble < 4; ++nibble, shift += 4)
            {
                ffe_t* nibble_lut = (ffe_t*)&lut.LUT[nibble * 16];

                for (unsigned x_nibble = 0; x_nibble < 16; ++x_nibble)
                {
                    const ffe_t prod = MultiplyLog(x_nibble << shift, static_cast<ffe_t>(log_m));
                    nibble_lut[x_nibble] = prod;
                }
            }
        }

        return;
    }

#if defined(LEO_TRY_AVX2)
    if (CpuHasAVX2)
        Multiply256LUT = reinterpret_cast<const Multiply256LUT_t*>(SIMDSafeAllocate(sizeof(Multiply256LUT_t) * kOrder));
    else
#endif // LEO_TRY_AVX2
        Multiply128LUT = reinterpret_cast<const Multiply128LUT_t*>(SIMDSafeAllocate(sizeof(Multiply128LUT_t) * kOrder));

    // For each value we could multiply by:
#pragma omp parallel for
    for (int log_m = 0; log_m < (int)kOrder; ++log_m)
    {
        // For each 4 bits of the finite field width in bits:
        for (unsigned i = 0, shift = 0; i < 4; ++i, shift += 4)
        {
            // Construct 16 entry LUT for PSHUFB
            uint8_t prod_lo[16], prod_hi[16];
            for (ffe_t x = 0; x < 16; ++x)
            {
                const ffe_t prod = MultiplyLog(x << shift, static_cast<ffe_t>(log_m));
                prod_lo[x] = static_cast<uint8_t>(prod);
                prod_hi[x] = static_cast<uint8_t>(prod >> 8);
            }

            const LEO_M128 value_lo = _mm_loadu_si128((LEO_M128*)prod_lo);
            const LEO_M128 value_hi = _mm_loadu_si128((LEO_M128*)prod_hi);

            // Store in 128-bit wide table
#if defined(LEO_TRY_AVX2)
            if (!CpuHasAVX2)
#endif // LEO_TRY_AVX2
            {
                _mm_storeu_si128((LEO_M128*)&Multiply128LUT[log_m].Lo[i], value_lo);
                _mm_storeu_si128((LEO_M128*)&Multiply128LUT[log_m].Hi[i], value_hi);
            }

            // Store in 256-bit wide table
#if defined(LEO_TRY_AVX2)
            if (CpuHasAVX2)
            {
                _mm256_storeu_si256((LEO_M256*)&Multiply256LUT[log_m].Lo[i],
                    _mm256_broadcastsi128_si256(value_lo));
                _mm256_storeu_si256((LEO_M256*)&Multiply256LUT[log_m].Hi[i],
                    _mm256_broadcastsi128_si256(value_hi));
            }
#endif // LEO_TRY_AVX2
        }
    }
}